

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_manager.hpp
# Opt level: O1

void __thiscall
foxxll::block_manager::
new_blocks<foxxll::random_cyclic,__gnu_cxx::__normal_iterator<foxxll::BID<0ul>*,std::vector<foxxll::BID<0ul>,std::allocator<foxxll::BID<0ul>>>>>
          (block_manager *this,random_cyclic *functor,
          __normal_iterator<foxxll::BID<0UL>_*,_std::vector<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>_>
          bid_begin,
          __normal_iterator<foxxll::BID<0UL>_*,_std::vector<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>_>
          bid_end,size_t alloc_offset)

{
  long *plVar1;
  vector<unsigned_long,std::allocator<unsigned_long>> *this_00;
  bool bVar2;
  value_type *ppdVar3;
  value_type pdVar4;
  size_t sVar5;
  iterator __position;
  size_type new_size;
  unsigned_long uVar6;
  long lVar7;
  external_size_type eVar8;
  void *__s;
  void *__s_00;
  value_type *pvVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  __normal_iterator<foxxll::BID<0UL>_*,_std::vector<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>_>
  _Var15;
  pointer pvVar16;
  bool bVar17;
  simple_vector<BIDType> bids;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  disk_out;
  unique_lock<std::mutex> lock;
  SimpleVector<foxxll::BID<0UL>,_(tlx::SimpleVectorMode)0> local_78;
  BID<0UL> *local_68;
  size_t local_60;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_58;
  unique_lock<std::mutex> local_40;
  
  local_40._M_device = &this->mutex_;
  local_40._M_owns = false;
  local_68 = bid_end._M_current;
  local_60 = alloc_offset;
  std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  uVar12 = this->ndisks_;
  if (uVar12 == 0) {
    __s = (void *)0x0;
  }
  else {
    uVar10 = 0xffffffffffffffff;
    if (uVar12 < 0x2000000000000000) {
      uVar10 = uVar12 * 8;
    }
    __s = operator_new__(uVar10);
  }
  if (uVar12 == 0) {
    __s_00 = (void *)0x0;
  }
  else {
    uVar10 = 0xffffffffffffffff;
    if (uVar12 < 0x2000000000000000) {
      uVar10 = uVar12 * 8;
    }
    __s_00 = operator_new__(uVar10);
  }
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector(&local_58,uVar12,(allocator_type *)&local_78);
  if (uVar12 != 0) {
    memset(__s,0,uVar12 << 3);
    memset(__s_00,0,uVar12 << 3);
  }
  local_78.size_ = 0;
  if ((long)local_68 - (long)bid_begin._M_current != 0) {
    local_68 = (BID<0UL> *)
               (((long)local_68 - (long)bid_begin._M_current >> 3) * -0x5555555555555555);
    _Var15._M_current = bid_begin._M_current;
    do {
      uVar12 = (functor->perm_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start
               [((long)(file **)local_78.size_ + local_60) % (functor->super_striping).diff_] +
               (functor->super_striping).begin_;
      ppdVar3 = (this->block_allocators_).array_;
      pdVar4 = ppdVar3[uVar12];
      sVar5 = (_Var15._M_current)->size;
      if (((pdVar4->autogrow_ == false) &&
          (pdVar4->free_bytes_ < *(long *)((long)__s_00 + uVar12 * 8) + sVar5)) &&
         (uVar10 = this->ndisks_, 1 < uVar10)) {
        uVar14 = 2;
        uVar13 = uVar12;
        do {
          uVar12 = ((uVar13 + uVar14) - 1) % uVar10;
          pdVar4 = ppdVar3[uVar12];
          bVar17 = pdVar4->free_bytes_ < *(long *)((long)__s_00 + uVar12 * 8) + sVar5;
          bVar2 = pdVar4->autogrow_;
          if (bVar17 && bVar2 == false) {
            uVar12 = uVar13;
          }
        } while ((uVar14 < uVar10) &&
                (uVar14 = uVar14 + 1, uVar13 = uVar12, bVar17 && bVar2 == false));
      }
      plVar1 = (long *)((long)__s + uVar12 * 8);
      *plVar1 = *plVar1 + 1;
      plVar1 = (long *)((long)__s_00 + uVar12 * 8);
      *plVar1 = *plVar1 + sVar5;
      this_00 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
                (local_58.
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar12);
      __position._M_current = *(unsigned_long **)(this_00 + 8);
      if (__position._M_current == *(unsigned_long **)(this_00 + 0x10)) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>(this_00,__position,&local_78.size_);
      }
      else {
        *__position._M_current = local_78.size_;
        *(unsigned_long **)(this_00 + 8) = __position._M_current + 1;
      }
      local_78.size_ = (long)(file **)local_78.size_ + 1;
      _Var15._M_current = _Var15._M_current + 1;
    } while (local_78.size_ < local_68);
  }
  local_78.size_ = 0;
  local_78.array_ = (BID<0UL> *)0x0;
  if (this->ndisks_ != 0) {
    uVar12 = 0;
    do {
      new_size = *(size_type *)((long)__s + uVar12 * 8);
      if (new_size != 0) {
        tlx::SimpleVector<foxxll::BID<0UL>,_(tlx::SimpleVectorMode)0>::resize(&local_78,new_size);
        pvVar16 = local_58.
                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar12;
        if (*(long *)((long)__s + uVar12 * 8) != 0) {
          uVar10 = 0;
          pvVar9 = local_78.array_;
          do {
            uVar6 = (pvVar16->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start[uVar10];
            pvVar9->size = bid_begin._M_current[uVar6].size;
            eVar8 = bid_begin._M_current[uVar6].offset;
            pvVar9->storage = bid_begin._M_current[uVar6].storage;
            pvVar9->offset = eVar8;
            uVar10 = uVar10 + 1;
            pvVar9 = pvVar9 + 1;
          } while (uVar10 < *(ulong *)((long)__s + uVar12 * 8));
        }
        disk_block_allocator::new_blocks<foxxll::BID<0ul>*>
                  ((this->block_allocators_).array_[uVar12],local_78.array_,
                   local_78.array_ + local_78.size_);
        lVar7 = *(long *)((long)__s + uVar12 * 8);
        if (lVar7 != 0) {
          lVar11 = 0;
          pvVar9 = local_78.array_;
          do {
            pvVar9->storage = (this->disk_files_).array_[uVar12].ptr_;
            uVar6 = (pvVar16->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start[lVar11];
            bid_begin._M_current[uVar6].size = pvVar9->size;
            eVar8 = pvVar9->offset;
            bid_begin._M_current[uVar6].storage = pvVar9->storage;
            bid_begin._M_current[uVar6].offset = eVar8;
            sVar5 = pvVar9->size;
            this->total_allocation_ = this->total_allocation_ + sVar5;
            this->current_allocation_ = this->current_allocation_ + sVar5;
            lVar11 = lVar11 + 1;
            pvVar9 = pvVar9 + 1;
          } while (lVar7 != lVar11);
        }
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < this->ndisks_);
  }
  uVar12 = this->current_allocation_;
  if (this->current_allocation_ < this->maximum_allocation_) {
    uVar12 = this->maximum_allocation_;
  }
  this->maximum_allocation_ = uVar12;
  if (local_78.array_ != (BID<0UL> *)0x0) {
    operator_delete__(local_78.array_);
  }
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&local_58);
  if (__s_00 != (void *)0x0) {
    operator_delete__(__s_00);
  }
  if (__s != (void *)0x0) {
    operator_delete__(__s);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_40);
  return;
}

Assistant:

void block_manager::new_blocks(
    const DiskAssignFunctor& functor,
    BIDIterator bid_begin, BIDIterator bid_end,
    size_t alloc_offset)
{
    std::unique_lock<std::mutex> lock(mutex_);

    using BIDType = typename std::iterator_traits<BIDIterator>::value_type;

    // choose disks for each block, sum up bytes allocated on a disk

    tlx::simple_vector<size_t> disk_blocks(ndisks_);
    tlx::simple_vector<uint64_t> disk_bytes(ndisks_);
    std::vector<std::vector<size_t> > disk_out(ndisks_);

    disk_blocks.fill(0);
    disk_bytes.fill(0);

    size_t bid_size = static_cast<size_t>(bid_end - bid_begin);

    BIDIterator bid = bid_begin;
    for (size_t i = 0; i < bid_size; ++i, ++bid)
    {
        size_t disk_id = functor(alloc_offset + i);

        if (!block_allocators_[disk_id]->has_available_space(
                disk_bytes[disk_id] + bid->size
            ))
        {
            // find disk (cyclically) that has enough free space for block

            for (size_t adv = 1; adv < ndisks_; ++adv)
            {
                size_t try_disk_id = (disk_id + adv) % ndisks_;
                if (block_allocators_[try_disk_id]->has_available_space(
                        disk_bytes[try_disk_id] + bid->size
                    ))
                {
                    disk_id = try_disk_id;
                    break;
                }
            }

            // if no disk has free space, pick first selected by functor
        }

        // assign block to disk
        disk_blocks[disk_id]++;
        disk_bytes[disk_id] += bid->size;
        disk_out[disk_id].push_back(i);
    }

    // allocate blocks on disks in sequence, then scatter blocks into output

    tlx::simple_vector<BIDType> bids;

    for (size_t d = 0; d < ndisks_; ++d)
    {
        if (disk_blocks[d] == 0) continue;
        bids.resize(disk_blocks[d]);

        std::vector<size_t>& bid_perm = disk_out[d];

        // collect bids from output (due to size field for BID<0>)
        for (size_t i = 0; i < disk_blocks[d]; ++i)
            bids[i] = bid_begin[bid_perm[i]];

        // let block_allocator fill in offset fields
        block_allocators_[d]->new_blocks(bids);

        // distributed bids back to output
        for (size_t i = 0; i < disk_blocks[d]; ++i) {
            bids[i].storage = disk_files_[d].get();

            TLX_LOGC(verbose_block_life_cycle) << "BLC:new    " << bids[i];
            bid_begin[bid_perm[i]] = bids[i];

            total_allocation_ += bids[i].size;
            current_allocation_ += bids[i].size;
        }
    }

    maximum_allocation_ = std::max(maximum_allocation_, current_allocation_);
}